

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O3

int LZ4_decompress_safe_usingDict
              (char *source,char *dest,int compressedSize,int maxOutputSize,char *dictStart,
              int dictSize)

{
  char *pcVar1;
  ushort *puVar2;
  char *pcVar3;
  byte bVar4;
  char cVar5;
  BYTE BVar6;
  ushort uVar7;
  undefined8 uVar8;
  ushort uVar9;
  uint uVar10;
  int iVar11;
  BYTE *pBVar12;
  ulong uVar13;
  byte *pbVar14;
  ushort *puVar15;
  BYTE *pBVar16;
  ushort *puVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  BYTE *pBVar21;
  BYTE *pBVar22;
  uint uVar23;
  ushort *puVar24;
  BYTE *pBVar25;
  BYTE *pBVar26;
  ushort *puVar27;
  BYTE *pBVar28;
  BYTE *pBVar29;
  long lVar30;
  char *pcVar31;
  char *pcVar32;
  char *pcVar33;
  size_t prefixSize;
  char *pcVar34;
  ulong uVar35;
  int iVar36;
  int iVar37;
  ushort *puVar38;
  ushort *puVar39;
  ulong uVar40;
  
  iVar36 = (int)dest;
  iVar11 = (int)source;
  if (dictSize == 0) {
    if (source == (char *)0x0) {
      return -1;
    }
    if (maxOutputSize == 0) {
      if (compressedSize != 1) {
        return -1;
      }
      return -(uint)(*source != '\0');
    }
    if (compressedSize == 0) {
      return -1;
    }
    puVar2 = (ushort *)(source + compressedSize);
    pBVar28 = (BYTE *)(dest + maxOutputSize);
    puVar27 = (ushort *)(source + (long)compressedSize + -0x10);
    pBVar22 = (BYTE *)dest;
    if (maxOutputSize < 0x40) goto LAB_001096df;
LAB_001092df:
    puVar39 = (ushort *)((long)source + 1);
    bVar4 = (byte)*(ushort *)source;
    uVar10 = (uint)bVar4;
    uVar35 = (ulong)(uint)(bVar4 >> 4);
    if (bVar4 >> 4 == 0xf) {
      if ((ushort *)((long)puVar2 - 0xfU) <= puVar39) goto LAB_00109713;
      puVar24 = (ushort *)((long)source + 2);
      uVar23 = 0;
      puVar17 = (ushort *)((long)source + 0x10);
      do {
        puVar38 = puVar39;
        puVar15 = puVar17;
        puVar39 = (ushort *)((long)puVar38 + 1);
        uVar23 = uVar23 + *(byte *)((long)puVar15 + -0xf);
        puVar24 = (ushort *)((long)puVar24 + 1);
        puVar17 = (ushort *)((long)puVar15 + 1);
      } while (puVar15 + -7 < (ushort *)((long)puVar2 - 0xfU) &&
               *(byte *)((long)puVar15 + -0xf) == 0xff);
      uVar35 = (ulong)uVar23 + 0xf;
      pBVar21 = pBVar22 + uVar35;
      if ((CARRY8((ulong)pBVar22,uVar35)) || ((ulong)-(long)puVar24 < uVar35)) {
        puVar39 = puVar15 + -7;
        goto LAB_00109713;
      }
      if (dest + (long)maxOutputSize + -0x20 < pBVar21) goto LAB_001095f5;
      puVar17 = (ushort *)((ulong)uVar23 + (long)puVar15 + 1);
      if (puVar2 + -0x10 < puVar17) {
        puVar39 = puVar15 + -7;
        goto LAB_001095f5;
      }
      lVar20 = 0;
      do {
        uVar8 = *(undefined8 *)((byte *)((long)puVar39 + lVar20) + 8);
        pBVar25 = pBVar22 + lVar20;
        *(undefined8 *)pBVar25 = *(undefined8 *)((long)puVar39 + lVar20);
        *(undefined8 *)(pBVar25 + 8) = uVar8;
        pbVar14 = (byte *)((long)puVar38 + lVar20 + 0x11);
        uVar8 = *(undefined8 *)(pbVar14 + 8);
        *(undefined8 *)(pBVar25 + 0x10) = *(undefined8 *)pbVar14;
        *(undefined8 *)(pBVar25 + 0x18) = uVar8;
        lVar20 = lVar20 + 0x20;
      } while (pBVar25 + 0x20 < pBVar21);
    }
    else {
      pBVar21 = pBVar22 + uVar35;
      if ((ushort *)((long)puVar2 - 0x11U) < puVar39) goto LAB_001095f5;
      uVar8 = *(undefined8 *)((long)source + 9);
      *(undefined8 *)pBVar22 = *(undefined8 *)puVar39;
      *(undefined8 *)(pBVar22 + 8) = uVar8;
      puVar17 = (ushort *)(uVar35 + (long)puVar39);
    }
    uVar7 = *puVar17;
    uVar40 = (ulong)uVar7;
    source = (char *)(puVar17 + 1);
    pBVar25 = pBVar21 + -uVar40;
    uVar13 = (ulong)(bVar4 & 0xf);
    if (uVar13 == 0xf) {
      puVar39 = (ushort *)source;
      if (pBVar25 < dest) goto LAB_00109713;
      uVar10 = 0;
      puVar17 = (ushort *)source;
      do {
        source = (char *)((long)puVar17 + 1);
        puVar39 = (ushort *)source;
        if (puVar2 + -2 <= source) goto LAB_00109713;
        uVar9 = *puVar17;
        uVar10 = uVar10 + (byte)uVar9;
        puVar17 = (ushort *)source;
      } while ((byte)uVar9 == 0xff);
      uVar35 = (ulong)uVar10;
      if ((BYTE *)(-uVar35 - 0x10) < pBVar21) goto LAB_00109713;
      uVar13 = uVar35 + 0x13;
      if (pBVar28 + -0x40 <= pBVar21 + uVar35 + 0x13) goto LAB_0010967c;
LAB_00109460:
      puVar39 = (ushort *)source;
      if (pBVar25 < dest) goto LAB_00109713;
      pBVar22 = pBVar21 + uVar13;
      if (uVar7 < 0x10) {
        LZ4_memcpy_using_offset(pBVar21,pBVar25,pBVar22,uVar40);
      }
      else {
        do {
          uVar8 = *(undefined8 *)(pBVar21 + -uVar40 + 8);
          *(undefined8 *)pBVar21 = *(undefined8 *)(pBVar21 + -uVar40);
          *(undefined8 *)(pBVar21 + 8) = uVar8;
          uVar8 = *(undefined8 *)(pBVar21 + -uVar40 + 0x10 + 8);
          *(undefined8 *)(pBVar21 + 0x10) = *(undefined8 *)(pBVar21 + -uVar40 + 0x10);
          *(undefined8 *)(pBVar21 + 0x18) = uVar8;
          pBVar21 = pBVar21 + 0x20;
        } while (pBVar21 < pBVar22);
      }
    }
    else {
      pBVar22 = pBVar21 + uVar13 + 4;
      uVar13 = uVar13 + 4;
      if (pBVar28 + -0x40 <= pBVar22) goto LAB_0010967c;
      if ((pBVar25 < dest) || (uVar7 < 8)) goto LAB_00109460;
      *(undefined8 *)pBVar21 = *(undefined8 *)pBVar25;
      *(undefined8 *)(pBVar21 + 8) = *(undefined8 *)(pBVar25 + 8);
      *(undefined2 *)(pBVar21 + 0x10) = *(undefined2 *)(pBVar25 + 0x10);
    }
    goto LAB_001092df;
  }
  prefixSize = (size_t)dictSize;
  if (dictStart + prefixSize == dest) {
    if (dictSize < 0xffff) {
      iVar11 = LZ4_decompress_safe_withSmallPrefix
                         (source,dest,compressedSize,maxOutputSize,prefixSize);
      return iVar11;
    }
    iVar37 = -1;
    if (source != (char *)0x0) {
      if (maxOutputSize == 0) {
        if (compressedSize == 1) {
          iVar37 = -(uint)(*source != '\0');
        }
      }
      else if (compressedSize != 0) {
        puVar2 = (ushort *)(source + compressedSize);
        lVar20 = (long)maxOutputSize;
        puVar27 = (ushort *)(source + (long)compressedSize + -0x10);
        if (0x3f < maxOutputSize) {
          lVar19 = 0;
LAB_00109e77:
          pcVar34 = dest + lVar19;
          puVar39 = (ushort *)((long)source + 1);
          bVar4 = (byte)*(ushort *)source;
          uVar10 = (uint)bVar4;
          uVar35 = (ulong)(uint)(bVar4 >> 4);
          if (bVar4 >> 4 == 0xf) {
            if ((ushort *)((long)puVar2 - 0xfU) <= puVar39) goto LAB_0010a2eb;
            puVar24 = (ushort *)((long)source + 2);
            uVar23 = 0;
            puVar17 = (ushort *)((long)source + 0x10);
            do {
              puVar38 = puVar39;
              puVar15 = puVar17;
              puVar39 = (ushort *)((long)puVar38 + 1);
              uVar23 = uVar23 + *(byte *)((long)puVar15 + -0xf);
              puVar24 = (ushort *)((long)puVar24 + 1);
              puVar17 = (ushort *)((long)puVar15 + 1);
            } while (puVar15 + -7 < (ushort *)((long)puVar2 - 0xfU) &&
                     *(byte *)((long)puVar15 + -0xf) == 0xff);
            uVar35 = (ulong)uVar23 + 0xf;
            if ((CARRY8((ulong)pcVar34,uVar35)) || ((ulong)-(long)puVar24 < uVar35)) {
              puVar39 = puVar15 + -7;
              goto LAB_0010a2eb;
            }
            lVar18 = lVar19 + uVar35;
            if (dest + lVar20 + -0x20 < dest + lVar18) goto LAB_0010a1ab;
            puVar17 = (ushort *)((ulong)uVar23 + (long)puVar15 + 1);
            if (puVar2 + -0x10 < puVar17) {
              puVar39 = puVar15 + -7;
              goto LAB_0010a1ab;
            }
            lVar19 = 0;
            do {
              uVar8 = *(undefined8 *)((byte *)((long)puVar39 + lVar19) + 8);
              pcVar3 = pcVar34 + lVar19;
              *(undefined8 *)pcVar3 = *(undefined8 *)((long)puVar39 + lVar19);
              *(undefined8 *)(pcVar3 + 8) = uVar8;
              pbVar14 = (byte *)((long)puVar38 + lVar19 + 0x11);
              uVar8 = *(undefined8 *)(pbVar14 + 8);
              *(undefined8 *)(pcVar3 + 0x10) = *(undefined8 *)pbVar14;
              *(undefined8 *)(pcVar3 + 0x18) = uVar8;
              lVar19 = lVar19 + 0x20;
            } while (pcVar3 + 0x20 < dest + lVar18);
          }
          else {
            lVar18 = lVar19 + uVar35;
            if ((ushort *)((long)puVar2 - 0x11U) < puVar39) goto LAB_0010a1ab;
            uVar8 = *(undefined8 *)((long)source + 9);
            *(undefined8 *)pcVar34 = *(undefined8 *)puVar39;
            *(undefined8 *)(pcVar34 + 8) = uVar8;
            puVar17 = (ushort *)(uVar35 + (long)puVar39);
          }
          pBVar28 = (BYTE *)(dest + lVar18);
          uVar7 = *puVar17;
          uVar35 = (ulong)uVar7;
          uVar23 = (uint)uVar7;
          source = (char *)(puVar17 + 1);
          lVar30 = lVar18 - uVar35;
          pBVar22 = (BYTE *)(dest + lVar30);
          uVar13 = (ulong)(bVar4 & 0xf);
          if (uVar13 == 0xf) {
            puVar39 = (ushort *)source;
            if (lVar30 < -0x10000) goto LAB_0010a2eb;
            uVar10 = 0;
            puVar17 = (ushort *)source;
            do {
              source = (char *)((long)puVar17 + 1);
              puVar39 = (ushort *)source;
              if (puVar2 + -2 <= source) goto LAB_0010a2eb;
              uVar9 = *puVar17;
              uVar10 = uVar10 + (byte)uVar9;
              puVar17 = (ushort *)source;
            } while ((byte)uVar9 == 0xff);
            uVar40 = (ulong)uVar10;
            if ((BYTE *)(-0x10 - uVar40) < pBVar28) goto LAB_0010a2eb;
            uVar13 = uVar40 + 0x13;
            if (dest + lVar20 + -0x40 <= pBVar28 + uVar40 + 0x13) goto LAB_0010a237;
LAB_0010a017:
            puVar39 = (ushort *)source;
            if (lVar30 < -0x10000) goto LAB_0010a2eb;
            lVar19 = lVar18 + uVar13;
            if (uVar7 < 0x10) {
              LZ4_memcpy_using_offset(pBVar28,pBVar22,(BYTE *)(dest + lVar19),uVar35);
            }
            else {
              do {
                uVar8 = *(undefined8 *)(pBVar28 + -uVar35 + 8);
                *(undefined8 *)pBVar28 = *(undefined8 *)(pBVar28 + -uVar35);
                *(undefined8 *)(pBVar28 + 8) = uVar8;
                uVar8 = *(undefined8 *)(pBVar28 + -uVar35 + 0x10 + 8);
                *(undefined8 *)(pBVar28 + 0x10) = *(undefined8 *)(pBVar28 + -uVar35 + 0x10);
                *(undefined8 *)(pBVar28 + 0x18) = uVar8;
                pBVar28 = pBVar28 + 0x20;
              } while (pBVar28 < dest + lVar19);
            }
          }
          else {
            lVar19 = lVar18 + uVar13 + 4;
            uVar13 = uVar13 + 4;
            if (dest + lVar20 + -0x40 <= dest + lVar19) goto LAB_0010a237;
            if (uVar7 < 8) goto LAB_0010a017;
            *(undefined8 *)pBVar28 = *(undefined8 *)pBVar22;
            *(undefined8 *)(pBVar28 + 8) = *(undefined8 *)(pBVar22 + 8);
            *(undefined2 *)(pBVar28 + 0x10) = *(undefined2 *)(pBVar22 + 0x10);
          }
          goto LAB_00109e77;
        }
        lVar19 = 0;
LAB_0010a2b3:
        bVar4 = (byte)*(ushort *)source;
        puVar39 = (ushort *)((long)source + 1);
        lVar18 = lVar19;
        while( true ) {
          pcVar34 = dest + lVar18;
          uVar10 = (uint)bVar4;
          if (bVar4 >> 4 == 0xf) break;
          uVar35 = (ulong)(uint)(bVar4 >> 4);
          if ((puVar27 <= puVar39) || (dest + lVar20 + -0x20 < pcVar34)) goto LAB_0010a1a8;
          uVar8 = *(undefined8 *)(puVar39 + 4);
          *(undefined8 *)pcVar34 = *(undefined8 *)puVar39;
          *(undefined8 *)(pcVar34 + 8) = uVar8;
          lVar18 = lVar19 + uVar35;
          uVar13 = (ulong)(uVar10 & 0xf);
          source = (char *)((ushort *)((long)puVar39 + uVar35) + 1);
          uVar7 = *(ushort *)((long)puVar39 + uVar35);
          uVar23 = (uint)uVar7;
          lVar30 = lVar18 - (ulong)uVar7;
          if (((uVar10 & 0xf) == 0xf) || (uVar7 < 8)) goto LAB_0010a1f6;
          *(undefined8 *)(dest + lVar18) = *(undefined8 *)(dest + lVar30);
          *(undefined8 *)(dest + lVar18 + 8) = *(undefined8 *)(dest + lVar30 + 8);
          *(undefined2 *)(dest + lVar18 + 0x10) = *(undefined2 *)(dest + lVar30 + 0x10);
          lVar19 = lVar18 + uVar13 + 4;
          lVar18 = uVar13 + lVar18 + 4;
          bVar4 = *(byte *)((long)puVar39 + uVar35 + 2);
          puVar39 = (ushort *)((long)puVar39 + uVar35 + 3);
        }
        if ((ushort *)((long)puVar2 - 0xfU) <= puVar39) goto LAB_0010a2eb;
        pbVar14 = (byte *)((long)puVar39 + 1);
        uVar23 = 0;
        do {
          uVar7 = *puVar39;
          puVar39 = (ushort *)((long)puVar39 + 1);
          uVar23 = uVar23 + (byte)uVar7;
          pbVar14 = pbVar14 + 1;
        } while (puVar39 < (ushort *)((long)puVar2 - 0xfU) && (byte)uVar7 == 0xff);
        uVar35 = (ulong)uVar23 + 0xf;
        if ((CARRY8((ulong)pcVar34,uVar35)) || ((ulong)-(long)pbVar14 < uVar35)) goto LAB_0010a2eb;
LAB_0010a1a8:
        lVar18 = lVar19 + uVar35;
LAB_0010a1ab:
        puVar17 = (ushort *)((long)puVar39 + uVar35);
        if ((dest + lVar18 <= dest + lVar20 + -0xc) && (puVar17 <= puVar2 + -4)) {
          do {
            *(undefined8 *)pcVar34 = *(undefined8 *)puVar39;
            pcVar34 = pcVar34 + 8;
            puVar39 = puVar39 + 4;
          } while (pcVar34 < dest + lVar18);
          uVar23 = (uint)*puVar17;
          source = (char *)(puVar17 + 1);
          lVar30 = lVar18 - (ulong)*puVar17;
          uVar13 = (ulong)(uVar10 & 0xf);
LAB_0010a1f6:
          if ((int)uVar13 == 0xf) {
            uVar10 = 0;
            do {
              puVar39 = (ushort *)source;
              source = (char *)((long)puVar39 + 1);
              if (puVar2 + -2 <= source) goto LAB_0010a2e8;
              uVar10 = uVar10 + (byte)*puVar39;
            } while ((byte)*puVar39 == 0xff);
            uVar13 = (ulong)uVar10 + 0xf;
            if (CARRY8((ulong)(dest + lVar18),uVar13)) {
LAB_0010a2e8:
              puVar39 = (ushort *)((long)puVar39 + 1);
              goto LAB_0010a2eb;
            }
          }
          uVar13 = uVar13 + 4;
LAB_0010a237:
          puVar39 = (ushort *)source;
          if (lVar30 < -0x10000) goto LAB_0010a2eb;
          pcVar34 = dest + lVar18;
          pcVar31 = dest + lVar30;
          lVar19 = lVar18 + uVar13;
          pcVar3 = dest + lVar19;
          if (uVar23 < 8) {
            pcVar34[0] = '\0';
            pcVar34[1] = '\0';
            pcVar34[2] = '\0';
            pcVar34[3] = '\0';
            *pcVar34 = *pcVar31;
            pcVar34[1] = pcVar31[1];
            pcVar34[2] = pcVar31[2];
            pcVar34[3] = pcVar31[3];
            uVar35 = (ulong)*(uint *)((long)inc32table + (ulong)(uVar23 << 2));
            *(undefined4 *)(pcVar34 + 4) = *(undefined4 *)(pcVar31 + uVar35);
            pcVar31 = pcVar31 + (uVar35 - (long)*(int *)((long)dec64table + (ulong)(uVar23 << 2)));
          }
          else {
            *(undefined8 *)pcVar34 = *(undefined8 *)pcVar31;
            pcVar31 = pcVar31 + 8;
          }
          pcVar1 = pcVar34 + 8;
          if (dest + lVar20 + -0xc < pcVar3) {
            if (dest + lVar20 + -5 < pcVar3) goto LAB_0010a2eb;
            pcVar34 = dest + lVar20 + -7;
            pcVar32 = pcVar31;
            pcVar33 = pcVar1;
            if (pcVar1 < pcVar34) {
              do {
                *(undefined8 *)pcVar33 = *(undefined8 *)pcVar32;
                pcVar33 = pcVar33 + 8;
                pcVar32 = pcVar32 + 8;
              } while (pcVar33 < pcVar34);
              pcVar31 = pcVar31 + ((long)pcVar34 - (long)pcVar1);
              pcVar1 = pcVar34;
            }
            for (; pcVar1 < pcVar3; pcVar1 = pcVar1 + 1) {
              cVar5 = *pcVar31;
              pcVar31 = pcVar31 + 1;
              *pcVar1 = cVar5;
            }
          }
          else {
            *(undefined8 *)pcVar1 = *(undefined8 *)pcVar31;
            if (0x10 < uVar13) {
              pcVar34 = pcVar34 + 0x10;
              do {
                pcVar31 = pcVar31 + 8;
                *(undefined8 *)pcVar34 = *(undefined8 *)pcVar31;
                pcVar34 = pcVar34 + 8;
              } while (pcVar34 < pcVar3);
            }
          }
          goto LAB_0010a2b3;
        }
        if ((puVar17 == puVar2) && (lVar18 <= lVar20)) {
          memmove(pcVar34,puVar39,uVar35);
          return ((int)pcVar34 + (int)uVar35) - iVar36;
        }
LAB_0010a2eb:
        iVar37 = ~(uint)puVar39 + iVar11;
      }
    }
    return iVar37;
  }
  if (source == (char *)0x0) {
    return -1;
  }
  pcVar34 = dictStart + prefixSize;
  if (dictStart == (char *)0x0) {
    pcVar34 = (char *)0x0;
  }
  if (maxOutputSize == 0) {
    if (compressedSize != 1) {
      return -1;
    }
    return -(uint)(*source != '\0');
  }
  if (compressedSize == 0) {
    return -1;
  }
  puVar2 = (ushort *)(source + compressedSize);
  pBVar28 = (BYTE *)(dest + maxOutputSize);
  puVar27 = (ushort *)(source + (long)compressedSize + -0x10);
  pBVar22 = (BYTE *)dest;
  if (maxOutputSize < 0x40) goto LAB_0010aa79;
  puVar39 = (ushort *)source;
LAB_0010a490:
  source = (char *)((long)puVar39 + 1);
  bVar4 = (byte)*puVar39;
  uVar10 = (uint)bVar4;
  uVar35 = (ulong)(uint)(bVar4 >> 4);
  if (bVar4 >> 4 == 0xf) {
    if ((ushort *)((long)puVar2 - 0xfU) <= source) goto LAB_0010aada;
    puVar17 = puVar39 + 1;
    uVar23 = 0;
    puVar39 = puVar39 + 8;
    do {
      puVar15 = puVar39;
      puVar24 = (ushort *)source;
      source = (char *)((long)puVar24 + 1);
      uVar23 = uVar23 + *(byte *)((long)puVar15 + -0xf);
      puVar17 = (ushort *)((long)puVar17 + 1);
      puVar39 = (ushort *)((long)puVar15 + 1);
    } while (puVar15 + -7 < (ushort *)((long)puVar2 - 0xfU) &&
             *(byte *)((long)puVar15 + -0xf) == 0xff);
    uVar35 = (ulong)uVar23 + 0xf;
    pBVar21 = pBVar22 + uVar35;
    if ((CARRY8((ulong)pBVar22,uVar35)) || ((ulong)-(long)puVar17 < uVar35)) {
      source = (char *)(puVar15 + -7);
      goto LAB_0010aada;
    }
    if (dest + (long)maxOutputSize + -0x20 < pBVar21) goto LAB_0010a8c0;
    puVar39 = (ushort *)((ulong)uVar23 + (long)puVar15 + 1);
    if (puVar2 + -0x10 < puVar39) {
      source = (char *)(puVar15 + -7);
      goto LAB_0010a8c0;
    }
    lVar20 = 0;
    do {
      uVar8 = *(undefined8 *)((byte *)((long)source + lVar20) + 8);
      pBVar25 = pBVar22 + lVar20;
      *(undefined8 *)pBVar25 = *(undefined8 *)((long)source + lVar20);
      *(undefined8 *)(pBVar25 + 8) = uVar8;
      pbVar14 = (byte *)((long)puVar24 + lVar20 + 0x11);
      uVar8 = *(undefined8 *)(pbVar14 + 8);
      *(undefined8 *)(pBVar25 + 0x10) = *(undefined8 *)pbVar14;
      *(undefined8 *)(pBVar25 + 0x18) = uVar8;
      lVar20 = lVar20 + 0x20;
    } while (pBVar25 + 0x20 < pBVar21);
  }
  else {
    pBVar21 = pBVar22 + uVar35;
    if ((ushort *)((long)puVar2 - 0x11U) < source) goto LAB_0010a8c0;
    uVar8 = *(undefined8 *)((long)puVar39 + 9);
    *(undefined8 *)pBVar22 = *(undefined8 *)source;
    *(undefined8 *)(pBVar22 + 8) = uVar8;
    puVar39 = (ushort *)(uVar35 + (long)source);
  }
  uVar7 = *puVar39;
  uVar13 = (ulong)uVar7;
  source = (char *)(puVar39 + 1);
  pBVar25 = pBVar21 + -uVar13;
  uVar35 = (ulong)(bVar4 & 0xf);
  if (uVar35 == 0xf) {
    if ((prefixSize < 0x10000) && (pBVar25 + prefixSize < dest)) goto LAB_0010aada;
    uVar10 = 0;
    puVar39 = (ushort *)source;
    do {
      source = (char *)((long)puVar39 + 1);
      if (puVar2 + -2 <= source) goto LAB_0010aada;
      uVar9 = *puVar39;
      uVar10 = uVar10 + (byte)uVar9;
      puVar39 = (ushort *)source;
    } while ((byte)uVar9 == 0xff);
    uVar35 = (ulong)uVar10;
    if ((BYTE *)(-uVar35 - 0x10) < pBVar21) goto LAB_0010aada;
    uVar40 = uVar35 + 0x13;
    if (pBVar28 + -0x40 <= pBVar21 + uVar35 + 0x13) goto LAB_0010a94c;
LAB_0010a63b:
    if ((prefixSize < 0x10000) && (pBVar25 + prefixSize < dest)) goto LAB_0010aada;
    pBVar12 = pBVar21 + uVar40;
    pBVar22 = pBVar12;
    puVar39 = (ushort *)source;
    if (pBVar25 < dest) {
      if (pBVar28 + -5 < pBVar12) goto LAB_0010aada;
      uVar35 = (long)dest - (long)pBVar25;
      uVar13 = uVar40 - uVar35;
      if (uVar40 < uVar35 || uVar13 == 0) {
        memmove(pBVar21,pcVar34 + -uVar35,uVar40);
      }
      else {
        memcpy(pBVar21,pcVar34 + -uVar35,uVar35);
        pBVar22 = pBVar21 + uVar35;
        if ((ulong)((long)pBVar22 - (long)dest) < uVar13) {
          pBVar21 = (BYTE *)dest;
          if (uVar35 < uVar40) {
            do {
              *pBVar22 = *pBVar21;
              pBVar22 = pBVar22 + 1;
              pBVar21 = pBVar21 + 1;
            } while (pBVar22 < pBVar12);
          }
        }
        else {
          memcpy(pBVar22,dest,uVar13);
          pBVar22 = pBVar12;
        }
      }
    }
    else if (uVar7 < 0x10) {
      LZ4_memcpy_using_offset(pBVar21,pBVar25,pBVar12,uVar13);
    }
    else {
      do {
        uVar8 = *(undefined8 *)(pBVar21 + -uVar13 + 8);
        *(undefined8 *)pBVar21 = *(undefined8 *)(pBVar21 + -uVar13);
        *(undefined8 *)(pBVar21 + 8) = uVar8;
        uVar8 = *(undefined8 *)(pBVar21 + -uVar13 + 0x10 + 8);
        *(undefined8 *)(pBVar21 + 0x10) = *(undefined8 *)(pBVar21 + -uVar13 + 0x10);
        *(undefined8 *)(pBVar21 + 0x18) = uVar8;
        pBVar21 = pBVar21 + 0x20;
      } while (pBVar21 < pBVar12);
    }
  }
  else {
    uVar40 = uVar35 + 4;
    if (pBVar28 + -0x40 <= pBVar21 + uVar35 + 4) goto LAB_0010a94c;
    if ((pBVar25 < dest) || (uVar7 < 8)) goto LAB_0010a63b;
    *(undefined8 *)pBVar21 = *(undefined8 *)pBVar25;
    *(undefined8 *)(pBVar21 + 8) = *(undefined8 *)(pBVar25 + 8);
    *(undefined2 *)(pBVar21 + 0x10) = *(undefined2 *)(pBVar25 + 0x10);
    pBVar22 = pBVar21 + uVar35 + 4;
    puVar39 = (ushort *)source;
  }
  goto LAB_0010a490;
LAB_0010967c:
  puVar39 = (ushort *)source;
  if (pBVar25 < dest) {
LAB_00109713:
    return ~(uint)puVar39 + iVar11;
  }
  pBVar22 = pBVar21 + uVar13;
  if ((uint)uVar40 < 8) {
    pBVar21[0] = '\0';
    pBVar21[1] = '\0';
    pBVar21[2] = '\0';
    pBVar21[3] = '\0';
    *pBVar21 = *pBVar25;
    pBVar21[1] = pBVar25[1];
    pBVar21[2] = pBVar25[2];
    pBVar21[3] = pBVar25[3];
    uVar35 = (ulong)((uint)uVar40 << 2);
    uVar40 = (ulong)*(uint *)((long)inc32table + uVar35);
    *(undefined4 *)(pBVar21 + 4) = *(undefined4 *)(pBVar25 + uVar40);
    pBVar25 = pBVar25 + (uVar40 - (long)*(int *)((long)dec64table + uVar35));
  }
  else {
    *(undefined8 *)pBVar21 = *(undefined8 *)pBVar25;
    pBVar25 = pBVar25 + 8;
  }
  pBVar12 = pBVar21 + 8;
  if (pBVar28 + -0xc < pBVar22) {
    if (pBVar28 + -5 < pBVar22) goto LAB_00109713;
    pBVar21 = pBVar28 + -7;
    pBVar16 = pBVar25;
    pBVar26 = pBVar12;
    if (pBVar12 < pBVar21) {
      do {
        *(undefined8 *)pBVar26 = *(undefined8 *)pBVar16;
        pBVar26 = pBVar26 + 8;
        pBVar16 = pBVar16 + 8;
      } while (pBVar26 < pBVar21);
      pBVar25 = pBVar25 + ((long)pBVar21 - (long)pBVar12);
      pBVar12 = pBVar21;
    }
    for (; pBVar12 < pBVar22; pBVar12 = pBVar12 + 1) {
      BVar6 = *pBVar25;
      pBVar25 = pBVar25 + 1;
      *pBVar12 = BVar6;
    }
  }
  else {
    *(undefined8 *)pBVar12 = *(undefined8 *)pBVar25;
    if (0x10 < uVar13) {
      pBVar21 = pBVar21 + 0x10;
      do {
        pBVar25 = pBVar25 + 8;
        *(undefined8 *)pBVar21 = *(undefined8 *)pBVar25;
        pBVar21 = pBVar21 + 8;
      } while (pBVar21 < pBVar22);
    }
  }
LAB_001096df:
  bVar4 = (byte)*(ushort *)source;
  puVar39 = (ushort *)((long)source + 1);
  while( true ) {
    uVar10 = (uint)bVar4;
    if (bVar4 >> 4 == 0xf) break;
    uVar35 = (ulong)(uint)(bVar4 >> 4);
    if ((puVar27 <= puVar39) || (dest + (long)maxOutputSize + -0x20 < pBVar22)) goto LAB_001095ef;
    uVar8 = *(undefined8 *)(puVar39 + 4);
    *(undefined8 *)pBVar22 = *(undefined8 *)puVar39;
    *(undefined8 *)(pBVar22 + 8) = uVar8;
    pBVar21 = pBVar22 + uVar35;
    uVar13 = (ulong)(uVar10 & 0xf);
    source = (char *)((ushort *)((long)puVar39 + uVar35) + 1);
    uVar7 = *(ushort *)((long)puVar39 + uVar35);
    uVar40 = (ulong)uVar7;
    pBVar25 = pBVar21 + -uVar40;
    if ((((uVar10 & 0xf) == 0xf) || (uVar7 < 8)) || (pBVar25 < dest)) goto LAB_0010963c;
    *(undefined8 *)pBVar21 = *(undefined8 *)pBVar25;
    *(undefined8 *)(pBVar21 + 8) = *(undefined8 *)(pBVar25 + 8);
    *(undefined2 *)(pBVar21 + 0x10) = *(undefined2 *)(pBVar25 + 0x10);
    pBVar22 = pBVar21 + uVar13 + 4;
    bVar4 = *(byte *)((long)puVar39 + uVar35 + 2);
    puVar39 = (ushort *)((long)puVar39 + uVar35 + 3);
  }
  if ((ushort *)((long)puVar2 - 0xfU) <= puVar39) goto LAB_00109713;
  pbVar14 = (byte *)((long)puVar39 + 1);
  uVar23 = 0;
  do {
    uVar7 = *puVar39;
    puVar39 = (ushort *)((long)puVar39 + 1);
    uVar23 = uVar23 + (byte)uVar7;
    pbVar14 = pbVar14 + 1;
  } while (puVar39 < (ushort *)((long)puVar2 - 0xfU) && (byte)uVar7 == 0xff);
  uVar35 = (ulong)uVar23 + 0xf;
  if ((CARRY8((ulong)pBVar22,uVar35)) || ((ulong)-(long)pbVar14 < uVar35)) goto LAB_00109713;
LAB_001095ef:
  pBVar21 = pBVar22 + uVar35;
LAB_001095f5:
  puVar17 = (ushort *)((long)puVar39 + uVar35);
  if ((pBVar28 + -0xc < pBVar21) || (puVar2 + -4 < puVar17)) {
    if ((puVar17 == puVar2) && (pBVar21 <= pBVar28)) {
      memmove(pBVar22,puVar39,uVar35);
      return ((int)pBVar22 + (int)uVar35) - iVar36;
    }
    goto LAB_00109713;
  }
  do {
    *(undefined8 *)pBVar22 = *(undefined8 *)puVar39;
    pBVar22 = pBVar22 + 8;
    puVar39 = puVar39 + 4;
  } while (pBVar22 < pBVar21);
  uVar40 = (ulong)*puVar17;
  source = (char *)(puVar17 + 1);
  pBVar25 = pBVar21 + -uVar40;
  uVar13 = (ulong)(uVar10 & 0xf);
LAB_0010963c:
  if ((int)uVar13 == 0xf) {
    uVar10 = 0;
    do {
      puVar39 = (ushort *)source;
      source = (char *)((long)puVar39 + 1);
      if (puVar2 + -2 <= source) goto LAB_00109710;
      uVar10 = uVar10 + (byte)*puVar39;
    } while ((byte)*puVar39 == 0xff);
    uVar13 = (ulong)uVar10 + 0xf;
    if (CARRY8((ulong)pBVar21,uVar13)) {
LAB_00109710:
      puVar39 = (ushort *)((long)puVar39 + 1);
      goto LAB_00109713;
    }
  }
  uVar13 = uVar13 + 4;
  goto LAB_0010967c;
LAB_0010a94c:
  if ((prefixSize < 0x10000) && (pBVar25 + prefixSize < dest)) goto LAB_0010aada;
  pBVar12 = pBVar21 + uVar40;
  pBVar22 = pBVar12;
  if (pBVar25 < dest) {
    if (pBVar28 + -5 < pBVar12) goto LAB_0010aada;
    uVar35 = (long)dest - (long)pBVar25;
    uVar13 = uVar40 - uVar35;
    if (uVar40 < uVar35 || uVar13 == 0) {
      memmove(pBVar21,pcVar34 + -uVar35,uVar40);
    }
    else {
      memcpy(pBVar21,pcVar34 + -uVar35,uVar35);
      pBVar22 = pBVar21 + uVar35;
      if ((ulong)((long)pBVar22 - (long)dest) < uVar13) {
        pBVar21 = (BYTE *)dest;
        if (uVar35 < uVar40) {
          do {
            *pBVar22 = *pBVar21;
            pBVar22 = pBVar22 + 1;
            pBVar21 = pBVar21 + 1;
          } while (pBVar22 < pBVar12);
        }
      }
      else {
        memcpy(pBVar22,dest,uVar13);
        pBVar22 = pBVar12;
      }
    }
  }
  else {
    if ((uint)uVar13 < 8) {
      pBVar21[0] = '\0';
      pBVar21[1] = '\0';
      pBVar21[2] = '\0';
      pBVar21[3] = '\0';
      *pBVar21 = *pBVar25;
      pBVar21[1] = pBVar25[1];
      pBVar21[2] = pBVar25[2];
      pBVar21[3] = pBVar25[3];
      uVar35 = (ulong)((uint)uVar13 << 2);
      uVar13 = (ulong)*(uint *)((long)inc32table + uVar35);
      *(undefined4 *)(pBVar21 + 4) = *(undefined4 *)(pBVar25 + uVar13);
      pBVar25 = pBVar25 + (uVar13 - (long)*(int *)((long)dec64table + uVar35));
    }
    else {
      *(undefined8 *)pBVar21 = *(undefined8 *)pBVar25;
      pBVar25 = pBVar25 + 8;
    }
    pBVar16 = pBVar21 + 8;
    if (pBVar28 + -0xc < pBVar12) {
      if (pBVar28 + -5 < pBVar12) goto LAB_0010aada;
      pBVar21 = pBVar28 + -7;
      pBVar26 = pBVar25;
      pBVar29 = pBVar16;
      if (pBVar16 < pBVar21) {
        do {
          *(undefined8 *)pBVar29 = *(undefined8 *)pBVar26;
          pBVar29 = pBVar29 + 8;
          pBVar26 = pBVar26 + 8;
        } while (pBVar29 < pBVar21);
        pBVar25 = pBVar25 + ((long)pBVar21 - (long)pBVar16);
        pBVar16 = pBVar21;
      }
      for (; pBVar16 < pBVar12; pBVar16 = pBVar16 + 1) {
        BVar6 = *pBVar25;
        pBVar25 = pBVar25 + 1;
        *pBVar16 = BVar6;
      }
    }
    else {
      *(undefined8 *)pBVar16 = *(undefined8 *)pBVar25;
      if (0x10 < uVar40) {
        pBVar21 = pBVar21 + 0x10;
        do {
          pBVar25 = pBVar25 + 8;
          *(undefined8 *)pBVar21 = *(undefined8 *)pBVar25;
          pBVar21 = pBVar21 + 8;
        } while (pBVar21 < pBVar12);
      }
    }
  }
LAB_0010aa79:
  bVar4 = (byte)*(ushort *)source;
  source = (char *)((long)source + 1);
  while( true ) {
    uVar10 = (uint)bVar4;
    if (bVar4 >> 4 == 0xf) break;
    uVar35 = (ulong)(uint)(bVar4 >> 4);
    if ((puVar27 <= source) || (dest + (long)maxOutputSize + -0x20 < pBVar22)) goto LAB_0010a8bc;
    uVar8 = *(undefined8 *)((long)source + 8);
    *(undefined8 *)pBVar22 = *(undefined8 *)source;
    *(undefined8 *)(pBVar22 + 8) = uVar8;
    pBVar21 = pBVar22 + uVar35;
    uVar40 = (ulong)(uVar10 & 0xf);
    puVar39 = (ushort *)((long)source + uVar35);
    uVar13 = (ulong)*puVar39;
    pBVar25 = pBVar21 + -uVar13;
    if ((((uVar10 & 0xf) == 0xf) || (*puVar39 < 8)) || (pBVar25 < dest)) goto LAB_0010a905;
    *(undefined8 *)pBVar21 = *(undefined8 *)pBVar25;
    *(undefined8 *)(pBVar21 + 8) = *(undefined8 *)(pBVar25 + 8);
    *(undefined2 *)(pBVar21 + 0x10) = *(undefined2 *)(pBVar25 + 0x10);
    pBVar22 = pBVar21 + uVar40 + 4;
    bVar4 = *(byte *)((long)source + uVar35 + 2);
    source = (char *)((long)source + uVar35 + 3);
  }
  if ((ushort *)((long)puVar2 - 0xfU) <= source) goto LAB_0010aada;
  pbVar14 = (byte *)((long)source + 1);
  uVar23 = 0;
  do {
    uVar7 = *(ushort *)source;
    source = (char *)((long)source + 1);
    uVar23 = uVar23 + (byte)uVar7;
    pbVar14 = pbVar14 + 1;
  } while (source < (ushort *)((long)puVar2 - 0xfU) && (byte)uVar7 == 0xff);
  uVar35 = (ulong)uVar23 + 0xf;
  if ((CARRY8((ulong)pBVar22,uVar35)) || ((ulong)-(long)pbVar14 < uVar35)) goto LAB_0010aada;
LAB_0010a8bc:
  pBVar21 = pBVar22 + uVar35;
LAB_0010a8c0:
  puVar39 = (ushort *)((long)source + uVar35);
  if ((pBVar28 + -0xc < pBVar21) || (puVar2 + -4 < puVar39)) {
    if ((puVar39 == puVar2) && (pBVar21 <= pBVar28)) {
      memmove(pBVar22,source,uVar35);
      return ((int)pBVar22 + (int)uVar35) - iVar36;
    }
    goto LAB_0010aada;
  }
  do {
    *(undefined8 *)pBVar22 = *(undefined8 *)source;
    pBVar22 = pBVar22 + 8;
    source = (char *)((long)source + 8);
  } while (pBVar22 < pBVar21);
  uVar13 = (ulong)*puVar39;
  pBVar25 = pBVar21 + -uVar13;
  uVar40 = (ulong)(uVar10 & 0xf);
LAB_0010a905:
  source = (char *)(puVar39 + 1);
  if ((int)uVar40 == 0xf) {
    uVar10 = 0;
    do {
      puVar39 = (ushort *)source;
      source = (char *)((long)puVar39 + 1);
      if (puVar2 + -2 <= source) goto LAB_0010aad7;
      uVar10 = uVar10 + (byte)*puVar39;
    } while ((byte)*puVar39 == 0xff);
    uVar40 = (ulong)uVar10 + 0xf;
    if (CARRY8((ulong)pBVar21,uVar40)) {
LAB_0010aad7:
      source = (char *)((long)puVar39 + 1);
LAB_0010aada:
      return ~(uint)source + iVar11;
    }
  }
  uVar40 = uVar40 + 4;
  goto LAB_0010a94c;
}

Assistant:

int LZ4_decompress_safe_usingDict(const char* source, char* dest, int compressedSize, int maxOutputSize, const char* dictStart, int dictSize)
{
    if (dictSize==0)
        return LZ4_decompress_safe(source, dest, compressedSize, maxOutputSize);
    if (dictStart+dictSize == dest) {
        if (dictSize >= 64 KB - 1) {
            return LZ4_decompress_safe_withPrefix64k(source, dest, compressedSize, maxOutputSize);
        }
        assert(dictSize >= 0);
        return LZ4_decompress_safe_withSmallPrefix(source, dest, compressedSize, maxOutputSize, (size_t)dictSize);
    }
    assert(dictSize >= 0);
    return LZ4_decompress_safe_forceExtDict(source, dest, compressedSize, maxOutputSize, dictStart, (size_t)dictSize);
}